

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

VarValue *
deqp::gles3::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  uint uVar1;
  deUint32 dVar2;
  uint uVar3;
  deBool dVar4;
  DataType dataType;
  DataType DVar5;
  undefined4 extraout_var;
  VarValue *extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VarValue *extraout_RAX_00;
  ulong uVar7;
  float fVar8;
  VarValue *pVVar6;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  pVVar6 = (VarValue *)CONCAT44(extraout_var,uVar1);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        fVar8 = deRandom_getFloat(&rnd->m_rnd);
        *(float *)((long)&__return_storage_ptr__->val + uVar7 * 4) = fVar8 * 20.0 + -10.0;
        uVar7 = uVar7 + 1;
        pVVar6 = extraout_RAX;
      } while (uVar1 != uVar7);
    }
  }
  else if (type - TYPE_INT < 4) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        dVar2 = deRandom_getUint32(&rnd->m_rnd);
        uVar3 = dVar2 % 0x15 - 10;
        pVVar6 = (VarValue *)(ulong)uVar3;
        *(uint *)((long)&__return_storage_ptr__->val + uVar7 * 4) = uVar3;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (type - TYPE_UINT < 4) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        dVar2 = deRandom_getUint32(&rnd->m_rnd);
        uVar3 = dVar2 - (dVar2 / 0xb + (dVar2 / 0xb) * 10);
        pVVar6 = (VarValue *)(ulong)uVar3;
        *(uint *)((long)&__return_storage_ptr__->val + uVar7 * 4) = uVar3;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (type - TYPE_BOOL < 4) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        dVar4 = deRandom_getBool(&rnd->m_rnd);
        pVVar6 = (VarValue *)CONCAT44(extraout_var_00,dVar4);
        (__return_storage_ptr__->val).boolV[uVar7] = dVar4 == 1;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else {
    pVVar6 = (VarValue *)(ulong)(type - TYPE_SAMPLER_1D);
    if (type - TYPE_SAMPLER_1D < 0x1e) {
      dataType = getSamplerLookupReturnType(type);
      DVar5 = glu::getDataTypeScalarType(dataType);
      uVar1 = glu::getDataTypeScalarSize(dataType);
      pVVar6 = (VarValue *)CONCAT44(extraout_var_01,uVar1);
      (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
      if (0 < (int)uVar1) {
        uVar7 = 0;
        do {
          if (DVar5 == TYPE_UINT) {
            dVar2 = deRandom_getUint32(&rnd->m_rnd);
            uVar3 = dVar2 - (dVar2 / 0xb + (dVar2 / 0xb) * 10);
LAB_011f781a:
            pVVar6 = (VarValue *)(ulong)uVar3;
            *(uint *)((long)&__return_storage_ptr__->val + uVar7 * 4 + 4) = uVar3;
          }
          else {
            if (DVar5 == TYPE_INT) {
              dVar2 = deRandom_getUint32(&rnd->m_rnd);
              uVar3 = dVar2 % 0x15 - 10;
              goto LAB_011f781a;
            }
            if (DVar5 == TYPE_FLOAT) {
              fVar8 = deRandom_getFloat(&rnd->m_rnd);
              *(float *)((long)&__return_storage_ptr__->val + uVar7 * 4 + 4) = fVar8 + 0.0;
              pVVar6 = extraout_RAX_00;
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
    }
  }
  return pVVar6;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeUintOrUVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.uintV[i] = (deUint32)rnd.getInt(0, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		const glu::DataType		texResultType		= getSamplerLookupReturnType(type);
		const glu::DataType		texResultScalarType	= glu::getDataTypeScalarType(texResultType);
		const int				texResultNumDims	= glu::getDataTypeScalarSize(texResultType);

		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < texResultNumDims; i++)
		{
			switch (texResultScalarType)
			{
				case glu::TYPE_FLOAT:	result.val.samplerV.fillColor.floatV[i]		= rnd.getFloat(0.0f, 1.0f);		break;
				case glu::TYPE_INT:		result.val.samplerV.fillColor.intV[i]		= rnd.getInt(-10, 10);			break;
				case glu::TYPE_UINT:	result.val.samplerV.fillColor.uintV[i]		= (deUint32)rnd.getInt(0, 10);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
	else
		DE_ASSERT(false);

	return result;
}